

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  invalid_argument *piVar6;
  Header *pHVar7;
  size_type sVar8;
  reference pvVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long in_RSI;
  int in_EDI;
  SetAttrVector *in_stack_00000018;
  int in_stack_00000024;
  SetAttrVector *in_stack_00000028;
  undefined4 in_stack_00000030;
  int in_stack_00000034;
  undefined4 in_stack_00000038;
  int in_stack_0000003c;
  char **in_stack_00000040;
  int in_stack_0000004c;
  char *in_stack_00000050;
  exception *e;
  DeepTiledOutputPart outPart_3;
  DeepTiledInputPart inPart_3;
  DeepScanLineOutputPart outPart_2;
  DeepScanLineInputPart inPart_2;
  TiledOutputPart outPart_1;
  TiledInputPart inPart_1;
  OutputPart outPart;
  InputPart inPart;
  string *type;
  Header *h_1;
  int p;
  MultiPartOutputFile out;
  SetAttr *attr;
  size_t i_1;
  Header h;
  int part_1;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  int numParts;
  MultiPartInputFile in;
  char *libraryVersion;
  char *attrName;
  int i;
  int part;
  SetAttrVector attrs;
  char *outFileName;
  char *inFileName;
  code *in_stack_fffffffffffffdb8;
  ostream *in_stack_fffffffffffffdc0;
  value_type *in_stack_fffffffffffffdc8;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *in_stack_fffffffffffffdd0;
  int *in_stack_fffffffffffffdd8;
  char **in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  char *pcVar10;
  char *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined8 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  SetAttrVector *in_stack_fffffffffffffe60;
  SetAttrVector *in_stack_fffffffffffffe68;
  char **in_stack_fffffffffffffe70;
  char **in_stack_fffffffffffffe78;
  char **in_stack_fffffffffffffe80;
  SetAttrVector *in_stack_fffffffffffffe88;
  SetAttrVector *in_stack_fffffffffffffe90;
  int *in_stack_fffffffffffffe98;
  char **in_stack_fffffffffffffea0;
  char **in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  DeepTiledOutputPart local_148 [8];
  _func_void_char_ptr_char_ptr *in_stack_fffffffffffffec0;
  DeepScanLineOutputPart local_138 [8];
  DeepScanLineInputPart local_130 [8];
  TiledOutputPart local_128 [8];
  TiledInputPart local_120 [8];
  OutputPart local_118 [8];
  InputPart local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  int local_f4;
  MultiPartOutputFile local_f0 [16];
  reference local_e0;
  ulong local_d8;
  Header local_d0 [60];
  int local_94;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> local_90;
  int local_74;
  MultiPartInputFile local_70 [16];
  char *local_60;
  int local_58;
  long local_48;
  int local_40;
  undefined4 local_3c;
  vector<SetAttr,_std::allocator<SetAttr>_> local_38;
  char *local_20;
  char *local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 2) {
    usageMessage(in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,false);
    local_4 = 1;
  }
  else {
    local_18 = (char *)0x0;
    local_20 = (char *)0x0;
    local_10 = in_RSI;
    local_8 = in_EDI;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::vector
              ((vector<SetAttr,_std::allocator<SetAttr>_> *)0x107699);
    local_3c = 0xffffffff;
    local_40 = 1;
    while (local_40 < local_8) {
      local_48 = *(long *)(local_10 + (long)local_40 * 8) + 1;
      iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-part");
      if (iVar3 == 0) {
        getPart(in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(int *)in_stack_fffffffffffffdd0
               );
      }
      else {
        iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-chromaticities");
        if (iVar3 == 0) {
          getChromaticities((char *)in_stack_fffffffffffffe90,
                            (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                            in_stack_fffffffffffffe80,(int *)in_stack_fffffffffffffe78,
                            (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                            in_stack_fffffffffffffe68);
        }
        else {
          iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-whiteLuminance");
          if (iVar3 == 0) {
            in_stack_fffffffffffffdb8 = (code *)0x0;
            getFloat((char *)in_stack_fffffffffffffe70,
                     (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     (char **)in_stack_fffffffffffffe60,
                     (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                     (SetAttrVector *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                     (_func_void_char_ptr_float *)in_stack_fffffffffffffe80);
          }
          else {
            iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-adoptedNeutral");
            if (iVar3 == 0) {
              in_stack_fffffffffffffdb8 = (code *)0x0;
              getV2f((char *)in_stack_fffffffffffffe80,
                     (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),in_stack_fffffffffffffe70,
                     (int *)in_stack_fffffffffffffe68,
                     (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                     (SetAttrVector *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (_func_void_char_ptr_V2f_ptr *)in_stack_fffffffffffffe90);
            }
            else {
              iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-renderingTransform");
              if (iVar3 == 0) {
                in_stack_fffffffffffffdb8 = (code *)0x0;
                getString((char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0,
                          in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                          in_stack_fffffffffffffe88,in_stack_fffffffffffffec0);
              }
              else {
                iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-lookModTransform");
                if (iVar3 == 0) {
                  in_stack_fffffffffffffdb8 = (code *)0x0;
                  getString((char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                            (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                            in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                            (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                            in_stack_fffffffffffffe88,in_stack_fffffffffffffec0);
                }
                else {
                  iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-xDensity");
                  if (iVar3 == 0) {
                    in_stack_fffffffffffffdb8 = isPositive;
                    getFloat((char *)in_stack_fffffffffffffe70,
                             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                             (char **)in_stack_fffffffffffffe60,
                             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                             (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                             (SetAttrVector *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                             (_func_void_char_ptr_float *)in_stack_fffffffffffffe80);
                  }
                  else {
                    iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-owner");
                    if (iVar3 == 0) {
                      in_stack_fffffffffffffdb8 = (code *)0x0;
                      getString((char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0
                                                ),(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                                in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                in_stack_fffffffffffffe88,in_stack_fffffffffffffec0);
                    }
                    else {
                      iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-comments");
                      if (iVar3 == 0) {
                        in_stack_fffffffffffffdb8 = (code *)0x0;
                        getString((char *)CONCAT44(in_stack_fffffffffffffeb4,
                                                   in_stack_fffffffffffffeb0),
                                  (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                                  in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                  (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                  in_stack_fffffffffffffe88,in_stack_fffffffffffffec0);
                      }
                      else {
                        iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-capDate");
                        if (iVar3 == 0) {
                          in_stack_fffffffffffffdb8 = isDate;
                          getString((char *)CONCAT44(in_stack_fffffffffffffeb4,
                                                     in_stack_fffffffffffffeb0),
                                    (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                                    in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                    (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                    in_stack_fffffffffffffe88,in_stack_fffffffffffffec0);
                        }
                        else {
                          iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-utcOffset");
                          if (iVar3 == 0) {
                            in_stack_fffffffffffffdb8 = (code *)0x0;
                            getFloat((char *)in_stack_fffffffffffffe70,
                                     (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                     (char **)in_stack_fffffffffffffe60,
                                     (int *)CONCAT44(in_stack_fffffffffffffe5c,
                                                     in_stack_fffffffffffffe58),
                                     (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                                     (SetAttrVector *)
                                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                     (_func_void_char_ptr_float *)in_stack_fffffffffffffe80);
                          }
                          else {
                            iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-longitude");
                            if (iVar3 == 0) {
                              in_stack_fffffffffffffdb8 = (code *)0x0;
                              getFloat((char *)in_stack_fffffffffffffe70,
                                       (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                       (char **)in_stack_fffffffffffffe60,
                                       (int *)CONCAT44(in_stack_fffffffffffffe5c,
                                                       in_stack_fffffffffffffe58),
                                       (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                                       (SetAttrVector *)
                                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                                       ,(_func_void_char_ptr_float *)in_stack_fffffffffffffe80);
                            }
                            else {
                              iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-latitude");
                              if (iVar3 == 0) {
                                in_stack_fffffffffffffdb8 = (code *)0x0;
                                getFloat((char *)in_stack_fffffffffffffe70,
                                         (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                         (char **)in_stack_fffffffffffffe60,
                                         (int *)CONCAT44(in_stack_fffffffffffffe5c,
                                                         in_stack_fffffffffffffe58),
                                         (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                                         (SetAttrVector *)
                                         CONCAT44(in_stack_fffffffffffffe4c,
                                                  in_stack_fffffffffffffe48),
                                         (_func_void_char_ptr_float *)in_stack_fffffffffffffe80);
                              }
                              else {
                                iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-altitude"
                                              );
                                if (iVar3 == 0) {
                                  in_stack_fffffffffffffdb8 = (code *)0x0;
                                  getFloat((char *)in_stack_fffffffffffffe70,
                                           (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                           (char **)in_stack_fffffffffffffe60,
                                           (int *)CONCAT44(in_stack_fffffffffffffe5c,
                                                           in_stack_fffffffffffffe58),
                                           (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                                           (SetAttrVector *)
                                           CONCAT44(in_stack_fffffffffffffe4c,
                                                    in_stack_fffffffffffffe48),
                                           (_func_void_char_ptr_float *)in_stack_fffffffffffffe80);
                                }
                                else {
                                  iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),"-focus")
                                  ;
                                  if (iVar3 == 0) {
                                    getPosFloatOrInf((char *)in_stack_00000040,in_stack_0000003c,
                                                     (char **)CONCAT44(in_stack_00000034,
                                                                       in_stack_00000030),
                                                     (int *)in_stack_00000028,in_stack_00000024,
                                                     in_stack_00000018);
                                  }
                                  else {
                                    iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),
                                                   "-expTime");
                                    if (iVar3 == 0) {
                                      in_stack_fffffffffffffdb8 = isPositive;
                                      getFloat((char *)in_stack_fffffffffffffe70,
                                               (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                               (char **)in_stack_fffffffffffffe60,
                                               (int *)CONCAT44(in_stack_fffffffffffffe5c,
                                                               in_stack_fffffffffffffe58),
                                               (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                                               (SetAttrVector *)
                                               CONCAT44(in_stack_fffffffffffffe4c,
                                                        in_stack_fffffffffffffe48),
                                               (_func_void_char_ptr_float *)
                                               in_stack_fffffffffffffe80);
                                    }
                                    else {
                                      iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),
                                                     "-aperture");
                                      if (iVar3 == 0) {
                                        in_stack_fffffffffffffdb8 = isPositive;
                                        getFloat((char *)in_stack_fffffffffffffe70,
                                                 (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                                 (char **)in_stack_fffffffffffffe60,
                                                 (int *)CONCAT44(in_stack_fffffffffffffe5c,
                                                                 in_stack_fffffffffffffe58),
                                                 (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                                                 (SetAttrVector *)
                                                 CONCAT44(in_stack_fffffffffffffe4c,
                                                          in_stack_fffffffffffffe48),
                                                 (_func_void_char_ptr_float *)
                                                 in_stack_fffffffffffffe80);
                                      }
                                      else {
                                        iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),
                                                       "-isoSpeed");
                                        if (iVar3 == 0) {
                                          in_stack_fffffffffffffdb8 = isPositive;
                                          getFloat((char *)in_stack_fffffffffffffe70,
                                                   (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                                   (char **)in_stack_fffffffffffffe60,
                                                   (int *)CONCAT44(in_stack_fffffffffffffe5c,
                                                                   in_stack_fffffffffffffe58),
                                                   (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                                                   (SetAttrVector *)
                                                   CONCAT44(in_stack_fffffffffffffe4c,
                                                            in_stack_fffffffffffffe48),
                                                   (_func_void_char_ptr_float *)
                                                   in_stack_fffffffffffffe80);
                                        }
                                        else {
                                          iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8),
                                                         "-envmap");
                                          if (iVar3 == 0) {
                                            getEnvmap(in_stack_00000050,in_stack_0000004c,
                                                      in_stack_00000040,
                                                      (int *)CONCAT44(in_stack_0000003c,
                                                                      in_stack_00000038),
                                                      in_stack_00000034,in_stack_00000028);
                                          }
                                          else {
                                            iVar3 = strcmp(*(char **)(local_10 + (long)local_40 * 8)
                                                           ,"-framesPerSecond");
                                            if (iVar3 == 0) {
                                              in_stack_fffffffffffffdb8 = (code *)0x0;
                                              getRational((char *)in_stack_fffffffffffffe80,
                                                          (int)((ulong)in_stack_fffffffffffffe78 >>
                                                               0x20),in_stack_fffffffffffffe70,
                                                          (int *)in_stack_fffffffffffffe68,
                                                          (int)((ulong)in_stack_fffffffffffffe60 >>
                                                               0x20),
                                                          (SetAttrVector *)
                                                          CONCAT44(in_stack_fffffffffffffe5c,
                                                                   in_stack_fffffffffffffe58),
                                                          (_func_void_char_ptr_Rational_ptr *)
                                                          in_stack_fffffffffffffe90);
                                            }
                                            else {
                                              iVar3 = strcmp(*(char **)(local_10 +
                                                                       (long)local_40 * 8),
                                                             "-keyCode");
                                              if (iVar3 == 0) {
                                                getKeyCode((char *)CONCAT44(
                                                  in_stack_fffffffffffffeb4,
                                                  in_stack_fffffffffffffeb0),
                                                  (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                                                  in_stack_fffffffffffffea0,
                                                  in_stack_fffffffffffffe98,
                                                  (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                                  in_stack_fffffffffffffe88);
                                              }
                                              else {
                                                iVar3 = strcmp(*(char **)(local_10 +
                                                                         (long)local_40 * 8),
                                                               "-timeCode");
                                                if (iVar3 == 0) {
                                                  getTimeCode((char *)in_stack_fffffffffffffe80,
                                                              (int)((ulong)in_stack_fffffffffffffe78
                                                                   >> 0x20),
                                                              in_stack_fffffffffffffe70,
                                                              (int *)in_stack_fffffffffffffe68,
                                                              (int)((ulong)in_stack_fffffffffffffe60
                                                                   >> 0x20),
                                                              (SetAttrVector *)
                                                              CONCAT44(in_stack_fffffffffffffe5c,
                                                                       in_stack_fffffffffffffe58));
                                                }
                                                else {
                                                  iVar3 = strcmp(*(char **)(local_10 +
                                                                           (long)local_40 * 8),
                                                                 "-wrapmodes");
                                                  if (iVar3 == 0) {
                                                    in_stack_fffffffffffffdb8 = (code *)0x0;
                                                    getString((char *)CONCAT44(
                                                  in_stack_fffffffffffffeb4,
                                                  in_stack_fffffffffffffeb0),
                                                  (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                                                  in_stack_fffffffffffffea0,
                                                  in_stack_fffffffffffffe98,
                                                  (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                                  in_stack_fffffffffffffe88,
                                                  in_stack_fffffffffffffec0);
                                                  }
                                                  else {
                                                    iVar3 = strcmp(*(char **)(local_10 +
                                                                             (long)local_40 * 8),
                                                                   "-pixelAspectRatio");
                                                    if (iVar3 == 0) {
                                                      in_stack_fffffffffffffdb8 = isPositive;
                                                      getFloat((char *)in_stack_fffffffffffffe70,
                                                               (int)((ulong)
                                                  in_stack_fffffffffffffe68 >> 0x20),
                                                  (char **)in_stack_fffffffffffffe60,
                                                  (int *)CONCAT44(in_stack_fffffffffffffe5c,
                                                                  in_stack_fffffffffffffe58),
                                                  (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                                                  (SetAttrVector *)
                                                  CONCAT44(in_stack_fffffffffffffe4c,
                                                           in_stack_fffffffffffffe48),
                                                  (_func_void_char_ptr_float *)
                                                  in_stack_fffffffffffffe80);
                                                  }
                                                  else {
                                                    iVar3 = strcmp(*(char **)(local_10 +
                                                                             (long)local_40 * 8),
                                                                   "-screenWindowWidth");
                                                    if (iVar3 == 0) {
                                                      in_stack_fffffffffffffdb8 = isNonNegative;
                                                      getFloat((char *)in_stack_fffffffffffffe70,
                                                               (int)((ulong)
                                                  in_stack_fffffffffffffe68 >> 0x20),
                                                  (char **)in_stack_fffffffffffffe60,
                                                  (int *)CONCAT44(in_stack_fffffffffffffe5c,
                                                                  in_stack_fffffffffffffe58),
                                                  (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                                                  (SetAttrVector *)
                                                  CONCAT44(in_stack_fffffffffffffe4c,
                                                           in_stack_fffffffffffffe48),
                                                  (_func_void_char_ptr_float *)
                                                  in_stack_fffffffffffffe80);
                                                  }
                                                  else {
                                                    iVar3 = strcmp(*(char **)(local_10 +
                                                                             (long)local_40 * 8),
                                                                   "-screenWindowCenter");
                                                    if (iVar3 == 0) {
                                                      in_stack_fffffffffffffdb8 = (code *)0x0;
                                                      getV2f((char *)in_stack_fffffffffffffe80,
                                                             (int)((ulong)in_stack_fffffffffffffe78
                                                                  >> 0x20),in_stack_fffffffffffffe70
                                                             ,(int *)in_stack_fffffffffffffe68,
                                                             (int)((ulong)in_stack_fffffffffffffe60
                                                                  >> 0x20),
                                                             (SetAttrVector *)
                                                             CONCAT44(in_stack_fffffffffffffe5c,
                                                                      in_stack_fffffffffffffe58),
                                                             (_func_void_char_ptr_V2f_ptr *)
                                                             in_stack_fffffffffffffe90);
                                                    }
                                                    else {
                                                      iVar3 = strcmp(*(char **)(local_10 +
                                                                               (long)local_40 * 8),
                                                                     "-string");
                                                      if (iVar3 == 0) {
                                                        getNameAndString(in_stack_fffffffffffffeb4,
                                                                         in_stack_fffffffffffffea8,
                                                                         (int *)
                                                  in_stack_fffffffffffffea0,
                                                  (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                                                  in_stack_fffffffffffffe90);
                                                  }
                                                  else {
                                                    iVar3 = strcmp(*(char **)(local_10 +
                                                                             (long)local_40 * 8),
                                                                   "-float");
                                                    if (iVar3 == 0) {
                                                      getNameAndFloat((int)((ulong)
                                                  in_stack_fffffffffffffe80 >> 0x20),
                                                  in_stack_fffffffffffffe78,
                                                  (int *)in_stack_fffffffffffffe70,
                                                  (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                                  in_stack_fffffffffffffe60);
                                                  }
                                                  else {
                                                    iVar3 = strcmp(*(char **)(local_10 +
                                                                             (long)local_40 * 8),
                                                                   "-int");
                                                    if (iVar3 == 0) {
                                                      getNameAndInt((int)((ulong)
                                                  in_stack_fffffffffffffe80 >> 0x20),
                                                  in_stack_fffffffffffffe78,
                                                  (int *)in_stack_fffffffffffffe70,
                                                  (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                                  in_stack_fffffffffffffe60);
                                                  }
                                                  else {
                                                    iVar3 = strcmp(*(char **)(local_10 +
                                                                             (long)local_40 * 8),
                                                                   "-h");
                                                    if ((iVar3 == 0) ||
                                                       (iVar3 = strcmp(*(char **)(local_10 +
                                                                                 (long)local_40 * 8)
                                                                       ,"--help"), iVar3 == 0)) {
                                                      usageMessage(in_stack_fffffffffffffdc0,
                                                                   (char *)in_stack_fffffffffffffdb8
                                                                   ,false);
                                                      local_4 = 0;
                                                      local_58 = 1;
                                                      goto LAB_00108ceb;
                                                    }
                                                    iVar3 = strcmp(*(char **)(local_10 +
                                                                             (long)local_40 * 8),
                                                                   "--version");
                                                    if (iVar3 == 0) {
                                                      local_60 = (char *)Imf_3_2::getLibraryVersion
                                                                                   ();
                                                      poVar5 = std::operator<<((ostream *)&std::cout
                                                                               ,
                                                  "exrstdattr (OpenEXR) ");
                                                  std::operator<<(poVar5,"3.2.0");
                                                  iVar3 = strcmp(local_60,"3.2.0");
                                                  if (iVar3 != 0) {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                             "(OpenEXR version ");
                                                    poVar5 = std::operator<<(poVar5,local_60);
                                                    std::operator<<(poVar5,")");
                                                  }
                                                  poVar5 = std::operator<<((ostream *)&std::cout,
                                                                           " https://openexr.com");
                                                  std::ostream::operator<<
                                                            (poVar5,std::
                                                  endl<char,std::char_traits<char>>);
                                                  poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "Copyright (c) Contributors to the OpenEXR Project"
                                                  );
                                                  std::ostream::operator<<
                                                            (poVar5,std::
                                                  endl<char,std::char_traits<char>>);
                                                  poVar5 = std::operator<<((ostream *)&std::cout,
                                                                           "License BSD-3-Clause");
                                                  std::ostream::operator<<
                                                            (poVar5,std::
                                                  endl<char,std::char_traits<char>>);
                                                  local_4 = 0;
                                                  local_58 = 1;
                                                  goto LAB_00108ceb;
                                                  }
                                                  if (local_18 == (char *)0x0) {
                                                    local_18 = *(char **)(local_10 +
                                                                         (long)local_40 * 8);
                                                  }
                                                  else {
                                                    local_20 = *(char **)(local_10 +
                                                                         (long)local_40 * 8);
                                                  }
                                                  local_40 = local_40 + 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (local_18 == (char *)0x0) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Missing input filename");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (local_20 == (char *)0x0) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Missing input filename");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    iVar3 = strcmp(local_18,local_20);
    if (iVar3 == 0) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Input and output cannot be the same file");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pcVar10 = local_18;
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_70,pcVar10,iVar3,true);
    local_74 = Imf_3_2::MultiPartInputFile::parts();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)0x10872e);
    for (local_94 = 0; local_94 < local_74; local_94 = local_94 + 1) {
      pHVar7 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_70);
      Imf_3_2::Header::Header(local_d0,pHVar7);
      for (local_d8 = 0; uVar1 = local_d8,
          sVar8 = std::vector<SetAttr,_std::allocator<SetAttr>_>::size(&local_38), uVar1 < sVar8;
          local_d8 = local_d8 + 1) {
        local_e0 = std::vector<SetAttr,_std::allocator<SetAttr>_>::operator[](&local_38,local_d8);
        if ((local_e0->part == -1) || (local_e0->part == local_94)) {
          Imf_3_2::Header::insert((string *)local_d0,(Attribute *)local_e0);
        }
        else if ((local_e0->part < 0) || (local_74 <= local_e0->part)) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Invalid part number ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_e0->part);
          poVar5 = std::operator<<(poVar5,". Part numbers in file ");
          poVar5 = std::operator<<(poVar5,local_18);
          poVar5 = std::operator<<(poVar5," go from 0 to ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_74 + -1);
          poVar5 = std::operator<<(poVar5,".");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          local_4 = 1;
          local_58 = 1;
          goto LAB_001089b7;
        }
      }
      std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      local_58 = 0;
LAB_001089b7:
      Imf_3_2::Header::~Header(local_d0);
      if (local_58 != 0) goto LAB_00108cd1;
    }
    pcVar10 = local_20;
    pvVar9 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[](&local_90,0)
    ;
    iVar3 = local_74;
    iVar4 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartOutputFile::MultiPartOutputFile(local_f0,pcVar10,pvVar9,iVar3,false,iVar4);
    for (local_f4 = 0; local_f4 < local_74; local_f4 = local_f4 + 1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              Imf_3_2::MultiPartInputFile::header((int)local_70);
      local_100 = __lhs;
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              Imf_3_2::Header::type_abi_cxx11_();
      local_108 = __rhs;
      _Var2 = std::operator==(__lhs,__rhs);
      if (_Var2) {
        Imf_3_2::InputPart::InputPart(local_110,local_70,local_f4);
        Imf_3_2::OutputPart::OutputPart(local_118,local_f0,local_f4);
        Imf_3_2::OutputPart::copyPixels((InputPart *)local_118);
      }
      else {
        _Var2 = std::operator==(__lhs,__rhs);
        if (_Var2) {
          Imf_3_2::TiledInputPart::TiledInputPart(local_120,local_70,local_f4);
          Imf_3_2::TiledOutputPart::TiledOutputPart(local_128,local_f0,local_f4);
          Imf_3_2::TiledOutputPart::copyPixels((TiledInputPart *)local_128);
        }
        else {
          _Var2 = std::operator==(__lhs,__rhs);
          if (_Var2) {
            Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart(local_130,local_70,local_f4);
            Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart(local_138,local_f0,local_f4);
            Imf_3_2::DeepScanLineOutputPart::copyPixels((DeepScanLineInputPart *)local_138);
          }
          else {
            _Var2 = std::operator==(__lhs,__rhs);
            if (_Var2) {
              Imf_3_2::DeepTiledInputPart::DeepTiledInputPart
                        ((DeepTiledInputPart *)&stack0xfffffffffffffec0,local_70,local_f4);
              Imf_3_2::DeepTiledOutputPart::DeepTiledOutputPart(local_148,local_f0,local_f4);
              Imf_3_2::DeepTiledOutputPart::copyPixels((DeepTiledInputPart *)local_148);
            }
          }
        }
      }
    }
    Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(local_f0);
    local_58 = 0;
LAB_00108cd1:
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector
              (in_stack_fffffffffffffdd0);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_70);
LAB_00108ceb:
    std::vector<SetAttr,_std::allocator<SetAttr>_>::~vector
              ((vector<SetAttr,_std::allocator<SetAttr>_> *)in_stack_fffffffffffffdd0);
    if (local_58 == 0) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
main (int argc, char** argv)
{
    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return 1;
    }

    try
    {
        const char* inFileName  = 0;
        const char* outFileName = 0;

        SetAttrVector attrs;
        int           part = -1;
        int           i    = 1;

        while (i < argc)
        {
            const char* attrName = argv[i] + 1;

            if (!strcmp (argv[i], "-part"))
            {
                getPart (attrName, argc, argv, i, part);
            }
            else if (!strcmp (argv[i], "-chromaticities"))
            {
                getChromaticities (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-whiteLuminance"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-adoptedNeutral"))
            {
                getV2f (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-renderingTransform"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-lookModTransform"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-xDensity"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-owner"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-comments"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-capDate"))
            {
                getString (attrName, argc, argv, i, part, attrs, isDate);
            }
            else if (!strcmp (argv[i], "-utcOffset"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-longitude"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-latitude"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-altitude"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-focus"))
            {
                getPosFloatOrInf (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-expTime"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-aperture"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-isoSpeed"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-envmap"))
            {
                getEnvmap (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-framesPerSecond"))
            {
                getRational (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-keyCode"))
            {
                getKeyCode (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-timeCode"))
            {
                getTimeCode (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-wrapmodes"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-pixelAspectRatio"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-screenWindowWidth"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isNonNegative);
            }
            else if (!strcmp (argv[i], "-screenWindowCenter"))
            {
                getV2f (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-string"))
            {
                getNameAndString (argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-float"))
            {
                getNameAndFloat (argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-int"))
            {
                getNameAndInt (argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                usageMessage (cout, "exrstdattr", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion();
            
                cout << "exrstdattr (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp(libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
                cout << "License BSD-3-Clause" << endl;

                return 0;
            }
            else
            {
                if (inFileName == 0)
                    inFileName = argv[i];
                else
                    outFileName = argv[i];

                i += 1;
            }
        }

        if (inFileName == 0)
            throw invalid_argument("Missing input filename");
        if (outFileName == 0)
            throw invalid_argument("Missing input filename");

        if (!strcmp (inFileName, outFileName))
            throw invalid_argument("Input and output cannot be the same file");

        //
        // Load the headers from the input file
        // and add attributes to the headers.
        //

        MultiPartInputFile in (inFileName);
        int                numParts = in.parts ();
        vector<Header>     headers;

        for (int part = 0; part < numParts; ++part)
        {
            Header h = in.header (part);

            for (size_t i = 0; i < attrs.size (); ++i)
            {
                const SetAttr& attr = attrs[i];

                if (attr.part == -1 || attr.part == part)
                {
                    h.insert (attr.name, *attr.attr);
                }
                else if (attr.part < 0 || attr.part >= numParts)
                {
                    cerr << "Invalid part number " << attr.part
                         << ". "
                            "Part numbers in file "
                         << inFileName
                         << " "
                            "go from 0 to "
                         << numParts - 1 << "." << endl;

                    return 1;
                }
            }

            headers.push_back (h);
        }

        //
        // Crete an output file with the modified headers,
        // and copy the pixels from the input file to the
        // output file.
        //

        MultiPartOutputFile out (outFileName, &headers[0], numParts);

        for (int p = 0; p < numParts; ++p)
        {
            const Header& h    = in.header (p);
            const string& type = h.type ();

            if (type == SCANLINEIMAGE)
            {
                InputPart  inPart (in, p);
                OutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
            else if (type == TILEDIMAGE)
            {
                TiledInputPart  inPart (in, p);
                TiledOutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
            else if (type == DEEPSCANLINE)
            {
                DeepScanLineInputPart  inPart (in, p);
                DeepScanLineOutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
            else if (type == DEEPTILE)
            {
                DeepTiledInputPart  inPart (in, p);
                DeepTiledOutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
        }
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}